

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row(nk_context *ctx,nk_layout_format fmt,float height,int cols,float *ratio)

{
  nk_panel *pnVar1;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float r;
  nk_panel *layout;
  nk_window *win;
  int n_undef;
  int i;
  float *ratio_local;
  int cols_local;
  float height_local;
  nk_layout_format fmt_local;
  nk_context *ctx_local;
  
  win._0_4_ = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4595,
                  "void nk_layout_row(struct nk_context *, enum nk_layout_format, float, int, const float *)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4596,
                  "void nk_layout_row(struct nk_context *, enum nk_layout_format, float, int, const float *)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4597,
                  "void nk_layout_row(struct nk_context *, enum nk_layout_format, float, int, const float *)"
                 );
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current->layout;
    nk_panel_layout(ctx,ctx->current,height,cols);
    if (fmt == NK_DYNAMIC) {
      local_44 = 0.0;
      (pnVar1->row).ratio = ratio;
      for (win._4_4_ = 0; win._4_4_ < cols; win._4_4_ = win._4_4_ + 1) {
        if (0.0 < ratio[win._4_4_] || ratio[win._4_4_] == 0.0) {
          local_44 = ratio[win._4_4_] + local_44;
        }
        else {
          win._0_4_ = (int)win + 1;
        }
      }
      if (1.0 - local_44 <= 1.0) {
        local_48 = 1.0 - local_44;
      }
      else {
        local_48 = 1.0;
      }
      if (local_48 <= 0.0) {
        local_50 = 0.0;
      }
      else {
        if (1.0 - local_44 <= 1.0) {
          local_4c = 1.0 - local_44;
        }
        else {
          local_4c = 1.0;
        }
        local_50 = local_4c;
      }
      (pnVar1->row).type = NK_LAYOUT_DYNAMIC;
      if ((local_50 <= 0.0) || ((int)win < 1)) {
        local_54 = 0.0;
      }
      else {
        local_54 = local_50 / (float)(int)win;
      }
      (pnVar1->row).item_width = local_54;
    }
    else {
      (pnVar1->row).ratio = ratio;
      (pnVar1->row).type = NK_LAYOUT_STATIC;
      (pnVar1->row).item_width = 0.0;
      (pnVar1->row).item_offset = 0.0;
    }
    (pnVar1->row).item_offset = 0.0;
    (pnVar1->row).filled = 0.0;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row(struct nk_context *ctx, enum nk_layout_format fmt,
    float height, int cols, const float *ratio)
{
    int i;
    int n_undef = 0;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    nk_panel_layout(ctx, win, height, cols);
    if (fmt == NK_DYNAMIC) {
        /* calculate width of undefined widget ratios */
        float r = 0;
        layout->row.ratio = ratio;
        for (i = 0; i < cols; ++i) {
            if (ratio[i] < 0.0f)
                n_undef++;
            else r += ratio[i];
        }
        r = NK_SATURATE(1.0f - r);
        layout->row.type = NK_LAYOUT_DYNAMIC;
        layout->row.item_width = (r > 0 && n_undef > 0) ? (r / (float)n_undef):0;
    } else {
        layout->row.ratio = ratio;
        layout->row.type = NK_LAYOUT_STATIC;
        layout->row.item_width = 0;
        layout->row.item_offset = 0;
    }
    layout->row.item_offset = 0;
    layout->row.filled = 0;
}